

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  csharp *pcVar1;
  string *value1;
  long lVar2;
  bool bVar3;
  mapped_type *pmVar4;
  FieldGeneratorBase *pFVar5;
  Options *pOVar6;
  Descriptor *pDVar7;
  long *plVar8;
  int i;
  int i_00;
  FileDescriptor *descriptor;
  FieldDescriptor *pFVar9;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  long lVar10;
  int j;
  long lVar11;
  allocator local_171;
  Printer *local_170;
  key_type local_168;
  csharp *local_148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  key_type local_90;
  string local_70;
  string local_50;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_((string *)&generator,this);
  std::__cxx11::string::string((string *)&local_168,"class_name",(allocator *)&local_110);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_168);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&generator);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&generator);
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&generator,&this->super_SourceGeneratorBase);
  std::__cxx11::string::string((string *)&local_168,"access_level",(allocator *)&local_110);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_168);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&generator);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&generator);
  WriteMessageDocComment(printer,this->descriptor_);
  AddDeprecatedFlag(this,printer);
  io::Printer::Print(printer,&vars,
                     "$access_level$ sealed partial class $class_name$ : pb::IMessage<$class_name$> {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n"
                    );
  pcVar1 = *(csharp **)(this->descriptor_ + 0x18);
  if (pcVar1 == (csharp *)0x0) {
    GetReflectionClassName_abi_cxx11_(&local_50,*(csharp **)(this->descriptor_ + 0x10),descriptor);
    std::operator+(&local_110,&local_50,".Descriptor.MessageTypes[");
    pDVar7 = this->descriptor_;
    plVar8 = (long *)(*(long *)(pDVar7 + 0x10) + 0x60);
    if (*(long *)(pDVar7 + 0x18) != 0) {
      plVar8 = (long *)(*(long *)(pDVar7 + 0x18) + 0x50);
    }
    SimpleItoa_abi_cxx11_
              (&local_70,(protobuf *)(((long)pDVar7 - *plVar8) / 0xa8 & 0xffffffff),
               (int)(((long)pDVar7 - *plVar8) % 0xa8));
    std::operator+(&local_168,&local_110,&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&generator,
                   &local_168,"]");
    std::__cxx11::string::string((string *)&local_90,"descriptor_accessor",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_90);
  }
  else {
    GetClassName_abi_cxx11_(&local_50,pcVar1,(Descriptor *)descriptor);
    std::operator+(&local_110,&local_50,".Descriptor.NestedTypes[");
    pDVar7 = this->descriptor_;
    plVar8 = (long *)(*(long *)(pDVar7 + 0x10) + 0x60);
    if (*(long *)(pDVar7 + 0x18) != 0) {
      plVar8 = (long *)(*(long *)(pDVar7 + 0x18) + 0x50);
    }
    SimpleItoa_abi_cxx11_
              (&local_70,(protobuf *)(((long)pDVar7 - *plVar8) / 0xa8 & 0xffffffff),
               (int)(((long)pDVar7 - *plVar8) % 0xa8));
    std::operator+(&local_168,&local_110,&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&generator,
                   &local_168,"]");
    std::__cxx11::string::string((string *)&local_90,"descriptor_accessor",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_90);
  }
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&generator);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&generator);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n"
                    );
  bVar3 = IsDescriptorOptionMessage(this->descriptor_);
  if (bVar3) {
    io::Printer::Print(printer,
                       "internal CustomOptions CustomOptions{ get; private set; } = CustomOptions.Empty;\n\n"
                      );
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n"
                    );
  GenerateCloningCode(this,printer);
  pFVar9 = (FieldDescriptor *)0x0;
  local_170 = printer;
  for (lVar10 = 0; pDVar7 = this->descriptor_, lVar10 < *(int *)(pDVar7 + 0x2c); lVar10 = lVar10 + 1
      ) {
    lVar11 = *(long *)(pDVar7 + 0x30);
    local_148 = (csharp *)(pFVar9 + lVar11);
    value1 = *(string **)(pFVar9 + lVar11);
    GetFieldConstantName_abi_cxx11_((string *)&generator,local_148,pFVar9);
    SimpleItoa_abi_cxx11_(&local_168,(protobuf *)(ulong)*(uint *)(pFVar9 + lVar11 + 0x38),i);
    io::Printer::Print(local_170,
                       "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
                       ,"field_name",value1,"field_constant_name",(string *)&generator,"index",
                       &local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&generator);
    generator.ptr_ = CreateFieldGeneratorInternal(this,(FieldDescriptor *)local_148);
    pFVar5 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&generator);
    printer = local_170;
    (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar5,local_170);
    io::Printer::Print(printer,"\n");
    if (generator.ptr_ != (FieldGeneratorBase *)0x0) {
      (*((generator.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
    }
    pFVar9 = pFVar9 + 0xa8;
  }
  pFVar9 = (FieldDescriptor *)0x0;
  while ((long)pFVar9 < (long)*(int *)(pDVar7 + 0x38)) {
    lVar10 = (long)pFVar9 * 0x30;
    local_148 = (csharp *)pFVar9;
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(pDVar7 + 0x40) + lVar10),false);
    std::__cxx11::string::string((string *)&local_168,"name",(allocator *)&local_110);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_168);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&generator);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&generator);
    UnderscoresToCamelCase
              ((string *)&generator,*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar10),true)
    ;
    std::__cxx11::string::string((string *)&local_168,"property_name",(allocator *)&local_110);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_168);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&generator);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&generator);
    std::__cxx11::string::string((string *)&generator,"original_name",(allocator *)&local_168);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(string *)&generator);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&generator);
    io::Printer::Print(printer,&vars,
                       "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
                      );
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"None = 0,\n");
    pFVar9 = extraout_RDX;
    for (lVar11 = 0; printer = local_170,
        lVar11 < *(int *)(*(long *)(this->descriptor_ + 0x40) + 0x1c + lVar10); lVar11 = lVar11 + 1)
    {
      pcVar1 = *(csharp **)
                (*(long *)(*(long *)(this->descriptor_ + 0x40) + lVar10 + 0x20) + lVar11 * 8);
      GetPropertyName_abi_cxx11_((string *)&generator,pcVar1,pFVar9);
      SimpleItoa_abi_cxx11_(&local_168,(protobuf *)(ulong)*(uint *)(pcVar1 + 0x38),i_00);
      io::Printer::Print(local_170,"$field_property_name$ = $index$,\n","field_property_name",
                         (string *)&generator,"index",&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&generator);
      pFVar9 = extraout_RDX_00;
    }
    io::Printer::Outdent(local_170);
    io::Printer::Print(printer,"}\n");
    io::Printer::Print(printer,&vars,
                       "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    io::Printer::Print(printer,&vars,
                       "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    io::Printer::Print(printer,&vars,
                       "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
                      );
    pDVar7 = this->descriptor_;
    pFVar9 = (FieldDescriptor *)(local_148 + 1);
  }
  GenerateFrameworkMethods(this,printer);
  GenerateMessageSerializationMethods(this,printer);
  GenerateMergingMethods(this,printer);
  bVar3 = HasNestedGeneratedTypes(this);
  if (bVar3) {
    io::Printer::Print(printer,&vars,
                       "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
    io::Printer::Print(printer,"public static partial class Types {\n");
    io::Printer::Indent(printer);
    lVar11 = 0;
    for (lVar10 = 0; pDVar7 = this->descriptor_, lVar10 < *(int *)(pDVar7 + 0x58);
        lVar10 = lVar10 + 1) {
      lVar2 = *(long *)(pDVar7 + 0x60);
      pOVar6 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)&generator,(EnumDescriptor *)(lVar2 + lVar11),pOVar6);
      EnumGenerator::Generate((EnumGenerator *)&generator,local_170);
      EnumGenerator::~EnumGenerator((EnumGenerator *)&generator);
      lVar11 = lVar11 + 0x38;
    }
    lVar11 = 0;
    for (lVar10 = 0; printer = local_170, lVar10 < *(int *)(pDVar7 + 0x48); lVar10 = lVar10 + 1) {
      lVar2 = *(long *)(pDVar7 + 0x50);
      if (*(char *)(*(long *)(lVar2 + 0x20 + lVar11) + 0x6b) == '\0') {
        pOVar6 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        MessageGenerator((MessageGenerator *)&generator,(Descriptor *)(lVar2 + lVar11),pOVar6);
        Generate((MessageGenerator *)&generator,local_170);
        ~MessageGenerator((MessageGenerator *)&generator);
        pDVar7 = this->descriptor_;
      }
      lVar11 = lVar11 + 0xa8;
    }
    io::Printer::Outdent(local_170);
    io::Printer::Print(printer,"}\n#endregion\n\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Print(printer,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  map<string, string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  
  printer->Print(
    vars,
    "$access_level$ sealed partial class $class_name$ : pb::IMessage<$class_name$> {\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
	  vars,
	  "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  WriteGeneratedCodeAttributes(printer);

  printer->Print(
	  vars,
	  "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] = GetReflectionClassName(descriptor_->file())
        + ".Descriptor.MessageTypes[" + SimpleItoa(descriptor_->index()) + "]";
  } else {
    vars["descriptor_accessor"] = GetClassName(descriptor_->containing_type())
        + ".Descriptor.NestedTypes[" + SimpleItoa(descriptor_->index()) + "]";
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
	vars,
	"public static pbr::MessageDescriptor Descriptor {\n"
	"  get { return $descriptor_accessor$; }\n"
	"}\n"
	"\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
	vars,
    "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
    "  get { return Descriptor; }\n"
    "}\n"
    "\n");
  // CustomOptions property, only for options messages
  if (IsDescriptorOptionMessage(descriptor_)) {
    printer->Print(
      "internal CustomOptions CustomOptions{ get; private set; } = CustomOptions.Empty;\n"
       "\n");
  }

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$() {\n"
    "  OnConstruction();\n"
    "}\n\n"
    "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
      "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
      "public const int $field_constant_name$ = $index$;\n",
      "field_name", fieldDescriptor->name(),
      "field_constant_name", GetFieldConstantName(fieldDescriptor),
      "index", SimpleItoa(fieldDescriptor->number()));
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    vars["original_name"] = descriptor_->oneof_decl(i)->name();
    printer->Print(
      vars,
      "private object $name$_;\n"
      "/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\n"
      "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print("$field_property_name$ = $index$,\n",
                     "field_property_name", GetPropertyName(field),
                     "index", SimpleItoa(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
	printer->Print(
	  vars,
	  "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	  vars,
	  "public $property_name$OneofCase $property_name$Case {\n"
	  "  get { return $name$Case_; }\n"
	  "}\n\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	  vars,
      "public void Clear$property_name$() {\n"
      "  $name$Case_ = $property_name$OneofCase.None;\n"
      "  $name$_ = null;\n"
      "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(
      vars,
      "#region Nested types\n"
      "/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(
            descriptor_->nested_type(i), this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n"
                   "#endregion\n"
                   "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}